

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_api_v2.c
# Opt level: O1

MPP_RET h264e_proc_cfg(void *ctx,MpiCmd cmd,void *param)

{
  long lVar1;
  MPP_RET MVar2;
  uint uVar3;
  
  lVar1 = *(long *)((long)ctx + 8);
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","enter ctx %p cmd %x param %p\n","h264e_proc_cfg",ctx,cmd,param);
  }
  if ((int)cmd < 0x320007) {
    if (cmd == MPP_ENC_SET_CFG) {
      if (*(int *)((long)param + 0x10) == 0) {
        MVar2 = MPP_OK;
      }
      else {
        MVar2 = h264e_proc_prep_cfg((MppEncPrepCfg *)(lVar1 + 8),
                                    (MppEncPrepCfg *)((long)param + 0x10));
      }
      if (*(int *)(lVar1 + 0x164) != 0) {
        uVar3 = (((*(int *)(lVar1 + 0xc + (ulong)(*(int *)(lVar1 + 0x168) == 0) * 4) + 0xf >> 4) +
                 *(uint *)(lVar1 + 0x16c)) - 1) / *(uint *)(lVar1 + 0x16c);
        if ((int)*(uint *)(lVar1 + 0xc4) < (int)uVar3) {
          uVar3 = *(uint *)(lVar1 + 0xc4);
        }
        *(uint *)(lVar1 + 0x170) = uVar3;
      }
      if (*(int *)((long)param + 0x350) != 0) {
        h264e_proc_h264_cfg((MppEncH264Cfg *)(lVar1 + 0x348),(MppEncH264Cfg *)((long)param + 0x350))
        ;
      }
      if (*(int *)((long)param + 0xe98) == 0) goto LAB_00236f8a;
      param = (void *)((long)param + 0xe98);
LAB_00236f7a:
      h264e_proc_split_cfg((MppEncSliceSplit *)(lVar1 + 0xe90),(MppEncSliceSplit *)param);
      goto LAB_00236f8a;
    }
    if (cmd == MPP_ENC_SET_PREP_CFG) {
      MVar2 = h264e_proc_prep_cfg((MppEncPrepCfg *)(lVar1 + 8),(MppEncPrepCfg *)param);
      goto LAB_00236f8a;
    }
  }
  else {
    MVar2 = MPP_OK;
    if (cmd == MPP_ENC_SET_CODEC_CFG) {
      h264e_proc_h264_cfg((MppEncH264Cfg *)(lVar1 + 0x348),(MppEncH264Cfg *)((long)param + 8));
      goto LAB_00236f8a;
    }
    MVar2 = MPP_OK;
    if (cmd == MPP_ENC_SET_SEI_CFG) goto LAB_00236f8a;
    if (cmd == MPP_ENC_SET_SPLIT) goto LAB_00236f7a;
  }
  _mpp_log_l(2,"h264e_api_v2","No correspond cmd found, and can not config!",(char *)0x0);
  MVar2 = MPP_NOK;
LAB_00236f8a:
  if (((*(int *)(lVar1 + 0xdc) == 2) && (*(int *)(lVar1 + 0xe4) == 0)) &&
     (*(int *)(lVar1 + 0x350) == 2)) {
    _mpp_log_l(2,"h264e_api_v2","poc type 2 is ocnflict with successive non-reference pskip mode\n",
               (char *)0x0);
    _mpp_log_l(2,"h264e_api_v2","set drop gap to 1\n",(char *)0x0);
    *(undefined4 *)(lVar1 + 0xe4) = 1;
  }
  if (((byte)h264e_debug & 1) != 0) {
    _mpp_log_l(4,"h264e_api_v2","leave ret %d\n","h264e_proc_cfg",(ulong)(uint)MVar2);
  }
  return MVar2;
}

Assistant:

static MPP_RET h264e_proc_cfg(void *ctx, MpiCmd cmd, void *param)
{
    MPP_RET ret = MPP_OK;
    H264eCtx *p = (H264eCtx *)ctx;
    MppEncCfgSet *cfg = p->cfg;

    h264e_dbg_func("enter ctx %p cmd %x param %p\n", ctx, cmd, param);

    switch (cmd) {
    case MPP_ENC_SET_CFG : {
        MppEncCfgImpl *impl = (MppEncCfgImpl *)param;
        MppEncCfgSet *src = &impl->cfg;

        if (src->prep.change)
            ret |= h264e_proc_prep_cfg(&cfg->prep, &src->prep);

        // TODO: rc cfg shouldn't be done here
        if (cfg->rc.refresh_en) {
            RK_U32 mb_rows;

            if (MPP_ENC_RC_INTRA_REFRESH_ROW == cfg->rc.refresh_mode)
                mb_rows = MPP_ALIGN(cfg->prep.height, 16) / 16;
            else
                mb_rows = MPP_ALIGN(cfg->prep.width, 16) / 16;

            cfg->rc.refresh_length = (mb_rows + cfg->rc.refresh_num - 1) / cfg->rc.refresh_num;
            if (cfg->rc.gop < cfg->rc.refresh_length)
                cfg->rc.refresh_length = cfg->rc.gop;
        }

        if (src->codec.h264.change)
            ret |= h264e_proc_h264_cfg(&cfg->codec.h264, &src->codec.h264);

        if (src->split.change)
            ret |= h264e_proc_split_cfg(&cfg->split, &src->split);
    } break;
    case MPP_ENC_SET_PREP_CFG : {
        ret = h264e_proc_prep_cfg(&cfg->prep, param);
    } break;
    case MPP_ENC_SET_CODEC_CFG : {
        MppEncCodecCfg *codec = (MppEncCodecCfg *)param;
        ret = h264e_proc_h264_cfg(&cfg->codec.h264, &codec->h264);
    } break;
    case MPP_ENC_SET_SEI_CFG : {
    } break;
    case MPP_ENC_SET_SPLIT : {
        ret = h264e_proc_split_cfg(&cfg->split, param);
    } break;
    default:
        mpp_err("No correspond cmd found, and can not config!");
        ret = MPP_NOK;
        break;
    }

    h264e_check_cfg(cfg);

    h264e_dbg_func("leave ret %d\n", ret);

    return ret;
}